

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::fixup_anonymous_struct_names(CompilerGLSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRType *type;
  long lVar6;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  visited;
  LoopLock local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar2 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar6 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar6);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeType) {
        type = Variant::get<spirv_cross::SPIRType>(pVVar4 + uVar1);
        if (type->basetype == Struct) {
          bVar5 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(type->super_IVariant).self.id,Block);
          if (!bVar5) {
            bVar5 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(type->super_IVariant).self.id,BufferBlock)
            ;
            if (!bVar5) goto LAB_002bf564;
          }
          fixup_anonymous_struct_names
                    (this,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&local_68,type);
        }
      }
LAB_002bf564:
      lVar6 = lVar6 + 4;
    } while (sVar2 << 2 != lVar6);
  }
  ParsedIR::LoopLock::~LoopLock(&local_70);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void CompilerGLSL::fixup_anonymous_struct_names()
{
	// HLSL codegen can often end up emitting anonymous structs inside blocks, which
	// breaks GL linking since all names must match ...
	// Try to emit sensible code, so attempt to find such structs and emit anon_$member.

	// Breaks exponential explosion with weird type trees.
	std::unordered_set<uint32_t> visited;

	ir.for_each_typed_id<SPIRType>([&](uint32_t, SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
		    (has_decoration(type.self, DecorationBlock) ||
		     has_decoration(type.self, DecorationBufferBlock)))
		{
			fixup_anonymous_struct_names(visited, type);
		}
	});
}